

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapUICommand.cxx
# Opt level: O0

bool cmQTWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  string_view sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  cmExecutionStatus *this;
  bool bVar2;
  size_type sVar3;
  cmMakefile *this_00;
  string *psVar4;
  string *psVar5;
  const_reference name;
  const_reference name_00;
  cmSourceFile *this_01;
  ulong uVar6;
  pointer pcVar7;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar8;
  undefined1 auVar9 [16];
  bool local_6d1;
  function<void_(cmSourceFile_*)> local_630;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_610;
  cmCustomCommandLines local_608;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  string local_5d8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_5b8;
  function<void_(cmSourceFile_*)> local_5b0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_590;
  cmCustomCommandLines local_588;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_570;
  string local_558;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_538;
  function<void_(cmSourceFile_*)> local_530;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_510;
  cmCustomCommandLines local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f0;
  string local_4d8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_4b8;
  __single_object cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  basic_string_view<char,_std::char_traits<char>_> local_488;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  pointer *local_458;
  undefined8 local_450;
  undefined1 local_448 [8];
  cmCustomCommandLines mocCommandLines;
  basic_string_view<char,_std::char_traits<char>_> local_420;
  undefined1 local_410 [16];
  basic_string_view<char,_std::char_traits<char>_> local_400;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  pointer *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0 [8];
  cmCustomCommandLines cxxCommandLines;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  pointer *local_368;
  undefined8 local_360;
  undefined1 local_358 [8];
  cmCustomCommandLines hCommandLines;
  string uiName;
  cmAlphaNum local_2f0;
  undefined1 local_2c0 [8];
  string mocName;
  cmAlphaNum local_270;
  undefined1 local_240 [8];
  string cxxName;
  cmAlphaNum local_1f0;
  undefined1 local_1c0 [8];
  string hName;
  string srcName;
  string local_178;
  cmSourceFile *local_158;
  cmSourceFile *curr;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_118;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string sourceListValue;
  string headerListValue;
  string *sourceList;
  string *headerList;
  string local_b8;
  string *local_98;
  string *moc_exe;
  string local_88;
  string *local_68;
  string *uic_exe;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar3 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    uic_exe = (string *)this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"QT_UIC_EXECUTABLE",(allocator<char> *)((long)&moc_exe + 7));
    psVar4 = cmMakefile::GetRequiredDefinition(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&moc_exe + 7));
    psVar5 = uic_exe;
    local_68 = psVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"QT_MOC_EXECUTABLE",(allocator<char> *)((long)&headerList + 7));
    psVar5 = cmMakefile::GetRequiredDefinition((cmMakefile *)psVar5,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&headerList + 7));
    local_98 = psVar5;
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
    name_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,2);
    psVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uic_exe,name);
    std::__cxx11::string::string
              ((string *)(sourceListValue.field_2._M_local_buf + 8),(string *)psVar5);
    psVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uic_exe,name_00);
    std::__cxx11::string::string((string *)&__range1,(string *)psVar5);
    cVar8 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
    __begin1 = cVar8.Begin._M_current;
    local_128 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&__begin1,3);
    local_118 = &local_128;
    __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(local_118);
    arg = (string *)
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::end(local_118);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      psVar5 = uic_exe;
      if (!bVar2) break;
      curr = (cmSourceFile *)
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
      this_01 = cmMakefile::GetSource((cmMakefile *)uic_exe,(string *)curr,Ambiguous);
      srcName.field_2._M_local_buf[0xe] = '\0';
      srcName.field_2._M_local_buf[0xd] = '\0';
      local_6d1 = false;
      local_158 = this_01;
      if (this_01 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        srcName.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"WRAP_EXCLUDE",
                   (allocator<char> *)(srcName.field_2._M_local_buf + 0xf));
        srcName.field_2._M_local_buf[0xd] = '\x01';
        local_6d1 = cmSourceFile::GetPropertyAsBool(this_01,&local_178);
      }
      if ((srcName.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_178);
      }
      if ((srcName.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(srcName.field_2._M_local_buf + 0xf));
      }
      if (((local_6d1 ^ 0xffU) & 1) != 0) {
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)((long)&hName.field_2 + 8),(string *)curr);
        psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)uic_exe);
        cmAlphaNum::cmAlphaNum(&local_1f0,psVar5);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&cxxName.field_2 + 8),'/');
        cmStrCat<std::__cxx11::string,char[3]>
                  ((string *)local_1c0,&local_1f0,(cmAlphaNum *)((long)&cxxName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&hName.field_2 + 8),(char (*) [3])0xbf594f);
        psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)uic_exe);
        cmAlphaNum::cmAlphaNum(&local_270,psVar5);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&mocName.field_2 + 8),'/');
        cmStrCat<std::__cxx11::string,char[5]>
                  ((string *)local_240,&local_270,(cmAlphaNum *)((long)&mocName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&hName.field_2 + 8),(char (*) [5])0xbfde3f);
        psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)uic_exe);
        cmAlphaNum::cmAlphaNum(&local_2f0,psVar5);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&uiName.field_2 + 8),"/moc_");
        cmStrCat<std::__cxx11::string,char[5]>
                  ((string *)local_2c0,&local_2f0,(cmAlphaNum *)((long)&uiName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&hName.field_2 + 8),(char (*) [5])0xbfde3f);
        std::__cxx11::string::string
                  ((string *)
                   &hCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = cmsys::SystemTools::FileIsFullPath((string *)curr);
        if (bVar2) {
          std::__cxx11::string::operator=
                    ((string *)
                     &hCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)curr);
        }
        else {
          if (local_158 == (cmSourceFile *)0x0) {
LAB_0034b54c:
            psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)uic_exe);
            std::__cxx11::string::operator=
                      ((string *)
                       &hCommandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar5);
          }
          else {
            bVar2 = cmSourceFile::GetIsGenerated(local_158,GlobalAndLocal);
            if (!bVar2) goto LAB_0034b54c;
            psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)uic_exe);
            std::__cxx11::string::operator=
                      ((string *)
                       &hCommandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar5);
          }
          std::__cxx11::string::operator+=
                    ((string *)
                     &hCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"/");
          std::__cxx11::string::operator+=
                    ((string *)
                     &hCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)curr);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)(sourceListValue.field_2._M_local_buf + 8),";")
          ;
        }
        std::__cxx11::string::operator+=
                  ((string *)(sourceListValue.field_2._M_local_buf + 8),(string *)local_1c0);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&__range1,";");
        }
        std::__cxx11::string::operator+=((string *)&__range1,(string *)local_240);
        std::__cxx11::string::operator+=((string *)&__range1,";");
        std::__cxx11::string::operator+=((string *)&__range1,(string *)local_2c0);
        cxxCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"-o");
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
        local_388 = auVar9;
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)
                            &hCommandLines.
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                             .
                             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_368 = &cxxCommandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_360 = 4;
        ilist_01._M_len = 4;
        ilist_01._M_array = (iterator)local_368;
        local_378 = auVar9;
        cmMakeSingleCommandLine((cmCustomCommandLines *)local_358,ilist_01);
        mocCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_420,"-impl")
        ;
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
        local_410 = auVar9;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_400,"-o");
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_240);
        local_3f0 = auVar9;
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)
                            &hCommandLines.
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                             .
                             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_3d0 = &mocCommandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3c8 = 6;
        ilist_00._M_len = 6;
        ilist_00._M_array = (iterator)local_3d0;
        local_3e0 = auVar9;
        cmMakeSingleCommandLine((cmCustomCommandLines *)local_3c0,ilist_00);
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_488,"-o");
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2c0);
        local_478 = auVar9;
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
        local_458 = &depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_450 = 4;
        ilist._M_len = 4;
        ilist._M_array = (iterator)local_458;
        local_468 = auVar9;
        cmMakeSingleCommandLine((cmCustomCommandLines *)local_448,ilist);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,(value_type *)
                           &hCommandLines.
                            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::make_unique<cmCustomCommand>();
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        std::__cxx11::string::string((string *)&local_4d8,(string *)local_1c0);
        cmCustomCommand::SetOutputs(pcVar7,&local_4d8);
        std::__cxx11::string::~string((string *)&local_4d8);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_4f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc);
        cmCustomCommand::SetDepends(pcVar7,&local_4f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4f0);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        cmCustomCommandLines::cmCustomCommandLines(&local_508,(cmCustomCommandLines *)local_358);
        cmCustomCommand::SetCommandLines(pcVar7,&local_508);
        cmCustomCommandLines::~cmCustomCommandLines(&local_508);
        psVar5 = uic_exe;
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                  (&local_510,&local_4b8);
        std::function<void_(cmSourceFile_*)>::function(&local_530,(nullptr_t)0x0);
        cmMakefile::AddCustomCommandToOutput((cmMakefile *)psVar5,&local_510,&local_530,false);
        std::function<void_(cmSourceFile_*)>::~function(&local_530);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_510);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,(value_type *)local_1c0);
        std::make_unique<cmCustomCommand>();
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator=
                  (&local_4b8,&local_538);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_538);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        std::__cxx11::string::string((string *)&local_558,(string *)local_240);
        cmCustomCommand::SetOutputs(pcVar7,&local_558);
        std::__cxx11::string::~string((string *)&local_558);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_570,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc);
        cmCustomCommand::SetDepends(pcVar7,&local_570);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_570);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        cmCustomCommandLines::cmCustomCommandLines(&local_588,(cmCustomCommandLines *)local_3c0);
        cmCustomCommand::SetCommandLines(pcVar7,&local_588);
        cmCustomCommandLines::~cmCustomCommandLines(&local_588);
        psVar5 = uic_exe;
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                  (&local_590,&local_4b8);
        std::function<void_(cmSourceFile_*)>::function(&local_5b0,(nullptr_t)0x0);
        cmMakefile::AddCustomCommandToOutput((cmMakefile *)psVar5,&local_590,&local_5b0,false);
        std::function<void_(cmSourceFile_*)>::~function(&local_5b0);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_590);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,(value_type *)local_1c0);
        std::make_unique<cmCustomCommand>();
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator=
                  (&local_4b8,&local_5b8);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_5b8);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        std::__cxx11::string::string((string *)&local_5d8,(string *)local_2c0);
        cmCustomCommand::SetOutputs(pcVar7,&local_5d8);
        std::__cxx11::string::~string((string *)&local_5d8);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_5f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc);
        cmCustomCommand::SetDepends(pcVar7,&local_5f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_5f0);
        pcVar7 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_4b8);
        cmCustomCommandLines::cmCustomCommandLines(&local_608,(cmCustomCommandLines *)local_448);
        cmCustomCommand::SetCommandLines(pcVar7,&local_608);
        cmCustomCommandLines::~cmCustomCommandLines(&local_608);
        psVar5 = uic_exe;
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                  (&local_610,&local_4b8);
        std::function<void_(cmSourceFile_*)>::function(&local_630,(nullptr_t)0x0);
        cmMakefile::AddCustomCommandToOutput((cmMakefile *)psVar5,&local_610,&local_630,false);
        std::function<void_(cmSourceFile_*)>::~function(&local_630);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_610);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_4b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cc);
        cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_448);
        cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_3c0);
        cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_358);
        std::__cxx11::string::~string
                  ((string *)
                   &hCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)local_2c0);
        std::__cxx11::string::~string((string *)local_240);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::string::~string((string *)(hName.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range1);
    cmMakefile::AddDefinition((cmMakefile *)psVar5,name_00,sVar1);
    psVar5 = uic_exe;
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(sourceListValue.field_2._M_local_buf + 8));
    cmMakefile::AddDefinition((cmMakefile *)psVar5,name,sVar1);
    args_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::string::~string((string *)(sourceListValue.field_2._M_local_buf + 8));
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmQTWrapUICommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the uic and moc executables to run in the custom commands.
  std::string const& uic_exe = mf.GetRequiredDefinition("QT_UIC_EXECUTABLE");
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& headerList = args[1];
  std::string const& sourceList = args[2];
  std::string headerListValue = mf.GetSafeDefinition(headerList);
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create rules for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(3)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the files to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string hName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".h");
      std::string cxxName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".cxx");
      std::string mocName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");

      // Compute the name of the ui file from which to generate others.
      std::string uiName;
      if (cmSystemTools::FileIsFullPath(arg)) {
        uiName = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          uiName = mf.GetCurrentBinaryDirectory();
        } else {
          uiName = mf.GetCurrentSourceDirectory();
        }
        uiName += "/";
        uiName += arg;
      }

      // create the list of headers
      if (!headerListValue.empty()) {
        headerListValue += ";";
      }
      headerListValue += hName;

      // create the list of sources
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += cxxName;
      sourceListValue += ";";
      sourceListValue += mocName;

      // set up .ui to .h and .cxx command
      cmCustomCommandLines hCommandLines =
        cmMakeSingleCommandLine({ uic_exe, "-o", hName, uiName });
      cmCustomCommandLines cxxCommandLines = cmMakeSingleCommandLine(
        { uic_exe, "-impl", hName, "-o", cxxName, uiName });
      cmCustomCommandLines mocCommandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", mocName, hName });

      std::vector<std::string> depends;
      depends.push_back(uiName);
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(hName);
      cc->SetDepends(depends);
      cc->SetCommandLines(hCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(cxxName);
      cc->SetDepends(depends);
      cc->SetCommandLines(cxxCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.clear();
      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(mocName);
      cc->SetDepends(depends);
      cc->SetCommandLines(mocCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files and headers.
  mf.AddDefinition(sourceList, sourceListValue);
  mf.AddDefinition(headerList, headerListValue);
  return true;
}